

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

Ssw_Sml_t * Ssw_SmlSimulateSeq(Aig_Man_t *pAig,int nPref,int nFrames,int nWords)

{
  int iVar1;
  Ssw_Sml_t *p;
  
  p = Ssw_SmlStart(pAig,nPref,nFrames,nWords);
  Ssw_SmlInitialize(p,1);
  Ssw_SmlSimulateOne(p);
  iVar1 = Ssw_SmlCheckNonConstOutputs(p);
  p->fNonConstOut = iVar1;
  return p;
}

Assistant:

Ssw_Sml_t * Ssw_SmlSimulateSeq( Aig_Man_t * pAig, int nPref, int nFrames, int nWords )
{
    Ssw_Sml_t * p;
    p = Ssw_SmlStart( pAig, nPref, nFrames, nWords );
    Ssw_SmlInitialize( p, 1 );
    Ssw_SmlSimulateOne( p );
    p->fNonConstOut = Ssw_SmlCheckNonConstOutputs( p );
    return p;
}